

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
booster::locale::basic_format<char>::write(basic_format<char> *this,int __fd,void *__buf,size_t __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int id;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  stream_type *out;
  string_type format;
  locale alStack_68 [8];
  string_type local_60;
  string_type local_40;
  
  out = (stream_type *)CONCAT44(in_register_00000034,__fd);
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (this->translate_ == true) {
    std::locale::locale(alStack_68,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
    booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    id = booster::locale::ios_info::domain_id();
    basic_message<char>::str_abi_cxx11_(&local_40,&this->message_,alStack_68,id);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    std::locale::~locale(alStack_68);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_60);
  }
  format_output(this,out,&local_60);
  sVar2 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
    sVar2 = extraout_RAX_00;
  }
  return sVar2;
}

Assistant:

void write(stream_type &out) const
            {
                string_type format;
                if(translate_)
                    format = message_.str(out.getloc(),ios_info::get(out).domain_id());
                else
                    format = format_;
               
                format_output(out,format);

            }